

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::deserialize_elems_noinsert<InputStream>(long param_1,undefined8 param_2,undefined8 param_3)

{
  long lVar1;
  long lVar2;
  tuple<char,_int> *elem;
  long lVar3;
  long lVar4;
  
  lVar3 = *(long *)(param_1 + 0x10);
  lVar2 = *(long *)(param_1 + 0x20);
  lVar4 = *(long *)(param_1 + 0x28);
  lVar1 = *(long *)(param_1 + 0x30);
  while (lVar3 != lVar1) {
    BuiltinDeserializer<std::tuple<char,int>,void>::deserialize_elems<InputStream,0ul,1ul>
              (lVar3,param_3);
    lVar3 = lVar3 + 8;
    if (lVar3 == lVar2) {
      lVar3 = *(long *)(lVar4 + 8);
      lVar4 = lVar4 + 8;
      lVar2 = lVar3 + 0x200;
    }
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }